

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_dist_wtd_convolve_2d_copy_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               ConvolveParams *conv_params)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  CONV_BUF_TYPE *pCVar7;
  uint uVar8;
  int iVar9;
  
  cVar5 = (char)conv_params->round_0 + (char)conv_params->round_1;
  if (0 < h) {
    pCVar7 = conv_params->dst;
    bVar2 = 0xe - cVar5;
    iVar3 = (1 << (0x16U - cVar5 & 0x1f)) + (1 << (0x15U - cVar5 & 0x1f));
    iVar1 = conv_params->dst_stride;
    uVar6 = 0;
    do {
      if (0 < w) {
        uVar4 = 0;
        do {
          uVar8 = ((uint)src[uVar4] << (bVar2 & 0x1f)) + iVar3;
          if (conv_params->do_average == 0) {
            pCVar7[uVar4] = (CONV_BUF_TYPE)uVar8;
          }
          else {
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              uVar8 = (uVar8 & 0xffff) + (uint)pCVar7[uVar4] >> 1;
            }
            else {
              uVar8 = (int)((uVar8 & 0xffff) * conv_params->bck_offset +
                           (uint)pCVar7[uVar4] * conv_params->fwd_offset) >> 4;
            }
            iVar9 = uVar8 + (((1 << (bVar2 & 0x1f)) >> 1) - iVar3);
            if (iVar9 >> (bVar2 & 0x1f) < 1) {
              iVar9 = 0;
            }
            iVar9 = iVar9 >> (bVar2 & 0x1f);
            if (0xfe < iVar9) {
              iVar9 = 0xff;
            }
            dst[uVar4] = (uint8_t)iVar9;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)w != uVar4);
      }
      uVar6 = uVar6 + 1;
      pCVar7 = pCVar7 + iVar1;
      dst = dst + dst_stride;
      src = src + src_stride;
    } while (uVar6 != (uint)h);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_copy_c(const uint8_t *src, int src_stride,
                                     uint8_t *dst, int dst_stride, int w, int h,
                                     ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      CONV_BUF_TYPE res = src[y * src_stride + x] << bits;
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}